

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JobResults.cpp
# Opt level: O2

void __thiscall
xmrig::JobResultsPrivate::JobResultsPrivate
          (JobResultsPrivate *this,IJobResultListener *listener,bool hwAES)

{
  uv_async_t *puVar1;
  undefined8 uVar2;
  
  this->m_hwAES = hwAES;
  this->m_listener = listener;
  (this->m_results).super__List_base<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_results;
  (this->m_results).super__List_base<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_results;
  (this->m_results).super__List_base<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>._M_impl.
  _M_node._M_size = 0;
  (this->m_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->m_bundles).super__List_base<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_bundles;
  (this->m_bundles).super__List_base<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_bundles;
  (this->m_bundles).super__List_base<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_>._M_impl.
  _M_node._M_size = 0;
  puVar1 = (uv_async_t *)operator_new(0x80);
  this->m_async = puVar1;
  puVar1->data = this;
  uVar2 = uv_default_loop();
  uv_async_init(uVar2,this->m_async,onResult);
  return;
}

Assistant:

inline JobResultsPrivate(IJobResultListener *listener, bool hwAES) :
        m_hwAES(hwAES),
        m_listener(listener)
    {
        m_async = new uv_async_t;
        m_async->data = this;

        uv_async_init(uv_default_loop(), m_async, JobResultsPrivate::onResult);
    }